

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_ArenaReleaseMessageTest_Test::
TestBody(GeneratedMessageReflectionTest_ArenaReleaseMessageTest_Test *this)

{
  TestAllTypes *this_00;
  Metadata MVar1;
  ReflectionTester reflection_tester;
  Arena arena;
  ReflectionTester local_130;
  ThreadSafeArena local_b0;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_b0);
  this_00 = (TestAllTypes *)
            Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_b0);
  MVar1 = proto2_unittest::TestAllTypes::GetMetadata
                    ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
  TestUtil::ReflectionTester::ReflectionTester(&local_130,MVar1.descriptor);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&local_130,(Message *)this_00,IS_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&local_130,(Message *)this_00);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&local_130,(Message *)this_00,NOT_NULL);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&local_130,(Message *)this_00);
  proto2_unittest::TestAllTypes::Clear(this_00);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            (&local_130,(Message *)this_00,CAN_BE_NULL);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_b0);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, ArenaReleaseMessageTest) {
  Arena arena;
  unittest::TestAllTypes* message =
      Arena::Create<unittest::TestAllTypes>(&arena);
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllTypes::descriptor());

  // When nothing is set, we expect all released messages to be nullptr.
  reflection_tester.ExpectMessagesReleasedViaReflection(
      message, TestUtil::ReflectionTester::IS_NULL);

  // After fields are set we should get non-nullptr releases.
  reflection_tester.SetAllFieldsViaReflection(message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      message, TestUtil::ReflectionTester::NOT_NULL);

  // After Clear() we may or may not get a message from ReleaseMessage().
  // This is implementation specific.
  reflection_tester.SetAllFieldsViaReflection(message);
  message->Clear();
  reflection_tester.ExpectMessagesReleasedViaReflection(
      message, TestUtil::ReflectionTester::CAN_BE_NULL);
}